

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool ClipperLib::IntersectPoint(TEdge *edge1,TEdge *edge2,IntPoint *ip,bool UseFullInt64Range)

{
  bool bVar1;
  long64 lVar2;
  double dVar3;
  double val;
  bool local_42;
  bool local_41;
  double b2;
  double b1;
  bool UseFullInt64Range_local;
  IntPoint *ip_local;
  TEdge *edge2_local;
  TEdge *edge1_local;
  
  bVar1 = SlopesEqual(edge1,edge2,UseFullInt64Range);
  if (bVar1) {
    edge1_local._7_1_ = false;
  }
  else {
    if ((edge1->dx <= -1e-20) || (1e-20 < edge1->dx || edge1->dx == 1e-20)) {
      if ((edge2->dx <= -1e-20) || (1e-20 < edge2->dx || edge2->dx == 1e-20)) {
        dVar3 = -(double)edge1->ybot * edge1->dx + (double)edge1->xbot;
        val = ((-(double)edge2->ybot * edge2->dx + (double)edge2->xbot) - dVar3) /
              (edge1->dx - edge2->dx);
        lVar2 = Round(val);
        ip->Y = lVar2;
        lVar2 = Round(edge1->dx * val + dVar3);
        ip->X = lVar2;
      }
      else {
        ip->X = edge2->xbot;
        if ((edge1->dx - -1e+40 <= -1e-20) || (1e-20 <= edge1->dx - -1e+40)) {
          lVar2 = Round((double)ip->X / edge1->dx +
                        ((double)edge1->ybot - (double)edge1->xbot / edge1->dx));
          ip->Y = lVar2;
        }
        else {
          ip->Y = edge1->ybot;
        }
      }
    }
    else {
      ip->X = edge1->xbot;
      if ((edge2->dx - -1e+40 <= -1e-20) || (1e-20 <= edge2->dx - -1e+40)) {
        lVar2 = Round((double)ip->X / edge2->dx +
                      ((double)edge2->ybot - (double)edge2->xbot / edge2->dx));
        ip->Y = lVar2;
      }
      else {
        ip->Y = edge2->ybot;
      }
    }
    if ((((ip->Y != edge1->ytop) || (ip->Y < edge2->ytop)) ||
        (local_41 = true, edge1->tmpX <= edge2->tmpX)) &&
       (((ip->Y != edge2->ytop || (ip->Y < edge1->ytop)) ||
        (local_41 = true, edge1->tmpX <= edge2->tmpX)))) {
      local_42 = false;
      if (edge1->ytop < ip->Y) {
        local_42 = edge2->ytop < ip->Y;
      }
      local_41 = local_42;
    }
    edge1_local._7_1_ = local_41;
  }
  return edge1_local._7_1_;
}

Assistant:

bool IntersectPoint(TEdge &edge1, TEdge &edge2,
  IntPoint &ip, bool UseFullInt64Range)
{
  double b1, b2;
  if (SlopesEqual(edge1, edge2, UseFullInt64Range)) return false;
  else if (NEAR_ZERO(edge1.dx))
  {
    ip.X = edge1.xbot;
    if (NEAR_EQUAL(edge2.dx, HORIZONTAL))
    {
      ip.Y = edge2.ybot;
    } else
    {
      b2 = edge2.ybot - (edge2.xbot/edge2.dx);
      ip.Y = Round(ip.X/edge2.dx + b2);
    }
  }
  else if (NEAR_ZERO(edge2.dx))
  {
    ip.X = edge2.xbot;
    if (NEAR_EQUAL(edge1.dx, HORIZONTAL))
    {
      ip.Y = edge1.ybot;
    } else
    {
      b1 = edge1.ybot - (edge1.xbot/edge1.dx);
      ip.Y = Round(ip.X/edge1.dx + b1);
    }
  } else
  {
    b1 = edge1.xbot - edge1.ybot * edge1.dx;
    b2 = edge2.xbot - edge2.ybot * edge2.dx;
    b2 = (b2-b1)/(edge1.dx - edge2.dx);
    ip.Y = Round(b2);
    ip.X = Round(edge1.dx * b2 + b1);
  }

  return
    //can be *so close* to the top of one edge that the rounded Y equals one ytop ...
    (ip.Y == edge1.ytop && ip.Y >= edge2.ytop && edge1.tmpX > edge2.tmpX) ||
    (ip.Y == edge2.ytop && ip.Y >= edge1.ytop && edge1.tmpX > edge2.tmpX) ||
    (ip.Y > edge1.ytop && ip.Y > edge2.ytop);
}